

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void ImGui::TableSetColumnWidthAutoSingle(ImGuiTable *table,int column_n)

{
  ImGuiTableColumn *pIVar1;
  
  if ((-1 < column_n) &&
     (pIVar1 = (table->Columns).Data + column_n, pIVar1 < (table->Columns).DataEnd)) {
    if ((pIVar1->IsEnabled == true) &&
       (pIVar1->AutoFitQueue = '\x02', pIVar1->CannotSkipItemsQueue = '\x01',
       (pIVar1->Flags & 4) != 0)) {
      table->AutoFitSingleStretchColumn = (ImGuiTableColumnIdx)column_n;
    }
    return;
  }
  __assert_fail("p >= Data && p < DataEnd",
                "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui_internal.h"
                ,0x20b,"T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]");
}

Assistant:

inline T&           operator[](int i)           { T* p = Data + i; IM_ASSERT(p >= Data && p < DataEnd); return *p; }